

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O3

int Gia_ManFilterEquivsForSpeculation
              (Gia_Man_t *pGia,char *pName1,char *pName2,int fLatchA,int fLatchB)

{
  uint *puVar1;
  Gia_Rpr_t GVar2;
  int *piVar3;
  ulong uVar4;
  int iVar5;
  Gia_Man_t *p0;
  Gia_Man_t *p1;
  Gia_Man_t *p;
  long lVar6;
  long lVar7;
  uint uVar8;
  char *pcVar9;
  ulong uVar10;
  uint uVar11;
  Gia_Rpr_t *pGVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  uint *puVar16;
  bool bVar17;
  uint local_40;
  
  if ((pGia->pReprs == (Gia_Rpr_t *)0x0) || (pGia->pNexts == (int *)0x0)) {
    pcVar9 = "Equivalences are not defined.\n";
LAB_00204119:
    Abc_Print(1,pcVar9);
  }
  else {
    p0 = Gia_AigerRead(pName1,0,0,0);
    if (p0 == (Gia_Man_t *)0x0) {
      pcVar9 = "Cannot read first file %s.\n";
      pName2 = pName1;
    }
    else {
      p1 = Gia_AigerRead(pName2,0,0,0);
      if (p1 != (Gia_Man_t *)0x0) {
        p = Gia_ManMiter(p0,p1,0,0,1,0,0);
        if (p == (Gia_Man_t *)0x0) {
          Gia_ManStop(p0);
          Gia_ManStop(p1);
          pcVar9 = "Cannot create sequential miter.\n";
        }
        else if (pGia->nObjs == p->nObjs) {
          iVar5 = bcmp(pGia->pObjs,p->pObjs,(long)pGia->nObjs * 0xc);
          if (iVar5 == 0) {
            Gia_ManCleanMark0(pGia);
            iVar5 = p0->nObjs;
            if (0 < iVar5) {
              lVar6 = 8;
              lVar7 = 0;
              do {
                if (p0->pObjs == (Gia_Obj_t *)0x0) break;
                uVar11 = *(uint *)(&p0->pObjs->field_0x0 + lVar6);
                if (uVar11 != 0xffffffff) {
                  if ((int)uVar11 < 0) goto LAB_00204564;
                  uVar11 = uVar11 >> 1;
                  if ((p->nObjs <= (int)uVar11) || (pGia->nObjs <= (int)uVar11)) goto LAB_00204545;
                  *(ulong *)(pGia->pObjs + uVar11) = *(ulong *)(pGia->pObjs + uVar11) | 0x40000000;
                  iVar5 = p0->nObjs;
                }
                lVar7 = lVar7 + 1;
                lVar6 = lVar6 + 0xc;
              } while (lVar7 < iVar5);
            }
            Gia_ManCleanMark1(pGia);
            iVar5 = p1->nObjs;
            if (0 < iVar5) {
              lVar6 = 8;
              lVar7 = 0;
              do {
                if (p1->pObjs == (Gia_Obj_t *)0x0) break;
                uVar11 = *(uint *)(&p1->pObjs->field_0x0 + lVar6);
                if (uVar11 != 0xffffffff) {
                  if ((int)uVar11 < 0) {
LAB_00204564:
                    __assert_fail("Lit >= 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                                  ,0x12f,"int Abc_Lit2Var(int)");
                  }
                  uVar11 = uVar11 >> 1;
                  if ((p->nObjs <= (int)uVar11) || (pGia->nObjs <= (int)uVar11)) {
LAB_00204545:
                    __assert_fail("v >= 0 && v < p->nObjs",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
                  }
                  *(ulong *)(pGia->pObjs + uVar11) =
                       *(ulong *)(pGia->pObjs + uVar11) | 0x4000000000000000;
                  iVar5 = p1->nObjs;
                }
                lVar7 = lVar7 + 1;
                lVar6 = lVar6 + 0xc;
              } while (lVar7 < iVar5);
            }
            uVar13 = (ulong)(uint)pGia->nObjs;
            if (pGia->nObjs < 2) {
              local_40 = 0;
            }
            else {
              lVar6 = 1;
              do {
                GVar2 = pGia->pReprs[lVar6];
                if (((uint)GVar2 & 0xfffffff) == 0) {
                  pGia->pReprs[lVar6] = (Gia_Rpr_t)((uint)GVar2 | 0xfffffff);
                  if (pGia->pNexts[lVar6] != 0) {
                    __assert_fail("pGia->pNexts[i] == 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                                  ,0x8e6,
                                  "int Gia_ManFilterEquivsForSpeculation(Gia_Man_t *, char *, char *, int, int)"
                                 );
                  }
                  uVar13 = (ulong)(uint)pGia->nObjs;
                }
                lVar6 = lVar6 + 1;
              } while (lVar6 < (int)uVar13);
              local_40 = 0;
              if (1 < (int)uVar13) {
                pGVar12 = pGia->pReprs;
                local_40 = 0;
                uVar10 = 1;
                do {
                  if (((~(uint)pGVar12[uVar10] & 0xfffffff) == 0) &&
                     (piVar3 = pGia->pNexts, 0 < piVar3[uVar10])) {
                    puVar16 = (uint *)(piVar3 + uVar10);
                    uVar8 = 0xffffffff;
                    uVar11 = 0xffffffff;
                    uVar15 = uVar10 & 0xffffffff;
                    do {
                      uVar14 = (uint)uVar15;
                      if ((int)uVar13 <= (int)uVar14) goto LAB_00204545;
                      if (uVar11 == 0xffffffff) {
                        uVar4 = *(ulong *)(pGia->pObjs + uVar15);
                        bVar17 = (uVar4 & 0x4000000040000000) != 0x40000000;
                        uVar11 = uVar14;
                        if (bVar17) {
                          uVar11 = 0xffffffff;
                        }
                        if ((bVar17 || fLatchA == 0) ||
                           ((((uint)uVar4 & 0x9fffffff) == 0x9fffffff &&
                            (uVar11 = uVar14,
                            pGia->vCis->nSize - pGia->nRegs <=
                            (int)((uint)(uVar4 >> 0x20) & 0x1fffffff))))) goto LAB_0020439d;
                        uVar11 = 0xffffffff;
                      }
                      else {
LAB_0020439d:
                        if (uVar8 == 0xffffffff) {
                          uVar4 = *(ulong *)(pGia->pObjs + uVar15);
                          uVar8 = 0xffffffff;
                          if (((uVar4 & 0x4000000040000000) == 0x4000000000000000) &&
                             ((fLatchB == 0 ||
                              ((((uint)uVar4 & 0x9fffffff) == 0x9fffffff &&
                               (pGia->vCis->nSize - pGia->nRegs <=
                                (int)((uint)(uVar4 >> 0x20) & 0x1fffffff))))))) {
                            uVar8 = uVar14;
                          }
                        }
                      }
                      puVar1 = (uint *)(piVar3 + uVar15);
                      uVar15 = (ulong)*puVar1;
                    } while (0 < (int)*puVar1);
                    uVar13 = uVar10 & 0xffffffff;
                    do {
                      uVar14 = *puVar16;
                      pGia->pReprs[(int)uVar13] =
                           (Gia_Rpr_t)((uint)pGia->pReprs[(int)uVar13] | 0xfffffff);
                      piVar3 = pGia->pNexts;
                      piVar3[(int)uVar13] = 0;
                      puVar16 = (uint *)(piVar3 + (int)uVar14);
                      uVar13 = (ulong)uVar14;
                    } while ((long)(int)uVar14 != 0);
                    pGVar12 = pGia->pReprs;
                    if (((~(uint)pGVar12[uVar10] & 0xfffffff) == 0) && (0 < piVar3[uVar10])) {
                      __assert_fail("!Gia_ObjIsHead(pGia, i)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                                    ,0x903,
                                    "int Gia_ManFilterEquivsForSpeculation(Gia_Man_t *, char *, char *, int, int)"
                                   );
                    }
                    if ((0 < (int)uVar11) && (0 < (int)uVar8)) {
                      uVar14 = uVar8;
                      if (uVar11 < uVar8) {
                        uVar14 = uVar11;
                      }
                      if (uVar8 < uVar11) {
                        uVar8 = uVar11;
                      }
                      if (uVar8 <= uVar14) {
                        __assert_fail("ClassA < ClassB",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                                      ,0x90c,
                                      "int Gia_ManFilterEquivsForSpeculation(Gia_Man_t *, char *, char *, int, int)"
                                     );
                      }
                      piVar3[uVar14] = uVar8;
                      pGVar12[uVar8] =
                           (Gia_Rpr_t)((uint)pGVar12[uVar8] & 0xf0000000 | uVar14 & 0xfffffff);
                      pGVar12 = pGia->pReprs;
                      if (((~(uint)pGVar12[uVar14] & 0xfffffff) != 0) || (pGia->pNexts[uVar14] < 1))
                      {
                        __assert_fail("Gia_ObjIsHead(pGia, ClassA)",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                                      ,0x910,
                                      "int Gia_ManFilterEquivsForSpeculation(Gia_Man_t *, char *, char *, int, int)"
                                     );
                      }
                      local_40 = local_40 + 1;
                    }
                  }
                  uVar10 = uVar10 + 1;
                  uVar13 = (ulong)pGia->nObjs;
                } while ((long)uVar10 < (long)uVar13);
              }
            }
            Abc_Print(1,"The number of two-node classes after filtering = %d.\n",(ulong)local_40);
            Gia_ManCleanMark0(pGia);
            Gia_ManCleanMark1(pGia);
            return 1;
          }
          Gia_ManStop(p0);
          Gia_ManStop(p1);
          Gia_ManStop(p);
          pcVar9 = "The AIG structure of the miter does not match.\n";
        }
        else {
          Gia_ManStop(p0);
          Gia_ManStop(p1);
          Gia_ManStop(p);
          pcVar9 = "The number of objects in different.\n";
        }
        goto LAB_00204119;
      }
      Gia_ManStop((Gia_Man_t *)0x0);
      pcVar9 = "Cannot read second file %s.\n";
    }
    Abc_Print(1,pcVar9,pName2);
  }
  return 0;
}

Assistant:

int Gia_ManFilterEquivsForSpeculation( Gia_Man_t * pGia, char * pName1, char * pName2, int fLatchA, int fLatchB )
{
    Gia_Man_t * pGia1, * pGia2, * pMiter;
    Gia_Obj_t * pObj1, * pObj2, * pObjM, * pObj;
    int i, iObj, iNext, Counter = 0;
    if ( pGia->pReprs == NULL || pGia->pNexts == NULL )
    {
        Abc_Print( 1, "Equivalences are not defined.\n" );
        return 0;
    }
    pGia1 = Gia_AigerRead( pName1, 0, 0, 0 );
    if ( pGia1 == NULL )
    {
        Abc_Print( 1, "Cannot read first file %s.\n", pName1 );
        return 0;
    }
    pGia2 = Gia_AigerRead( pName2, 0, 0, 0 );
    if ( pGia2 == NULL )
    {
        Gia_ManStop( pGia2 );
        Abc_Print( 1, "Cannot read second file %s.\n", pName2 );
        return 0;
    }
    pMiter = Gia_ManMiter( pGia1, pGia2, 0, 0, 1, 0, 0 );
    if ( pMiter == NULL )
    {
        Gia_ManStop( pGia1 );
        Gia_ManStop( pGia2 );
        Abc_Print( 1, "Cannot create sequential miter.\n" );
        return 0;
    }
    // make sure the miter is isomorphic
    if ( Gia_ManObjNum(pGia) != Gia_ManObjNum(pMiter) )
    {
        Gia_ManStop( pGia1 );
        Gia_ManStop( pGia2 );
        Gia_ManStop( pMiter );
        Abc_Print( 1, "The number of objects in different.\n" );
        return 0;
    }
    if ( memcmp( pGia->pObjs, pMiter->pObjs, sizeof(Gia_Obj_t) *  Gia_ManObjNum(pGia) ) )
    {
        Gia_ManStop( pGia1 );
        Gia_ManStop( pGia2 );
        Gia_ManStop( pMiter );
        Abc_Print( 1, "The AIG structure of the miter does not match.\n" );
        return 0;
    }
    // transfer copies
    Gia_ManCleanMark0( pGia );
    Gia_ManForEachObj( pGia1, pObj1, i )
    {
        if ( pObj1->Value == ~0 )
            continue;
        pObjM = Gia_ManObj( pMiter, Abc_Lit2Var(pObj1->Value) );
        pObj = Gia_ManObj( pGia, Gia_ObjId(pMiter, pObjM) );
        pObj->fMark0 = 1;
    }
    Gia_ManCleanMark1( pGia );
    Gia_ManForEachObj( pGia2, pObj2, i )
    {
        if ( pObj2->Value == ~0 )
            continue;
        pObjM = Gia_ManObj( pMiter, Abc_Lit2Var(pObj2->Value) );
        pObj = Gia_ManObj( pGia, Gia_ObjId(pMiter, pObjM) );
        pObj->fMark1 = 1;
    }

    // filter equivalences
    Gia_ManForEachConst( pGia, i )
    {
        Gia_ObjUnsetRepr( pGia, i );
        assert( pGia->pNexts[i] == 0 );
    }
    Gia_ManForEachClass( pGia, i )
    {
        // find the first colorA and colorB
        int ClassA = -1, ClassB = -1;
        Gia_ClassForEachObj( pGia, i, iObj )
        {
            pObj = Gia_ManObj( pGia, iObj );
            if ( ClassA == -1 && pObj->fMark0 && !pObj->fMark1 )
            {
                if ( fLatchA && !Gia_ObjIsRo(pGia, pObj) )
                    continue;
                ClassA = iObj;
            }
            if ( ClassB == -1 && pObj->fMark1 && !pObj->fMark0 )
            {
                if ( fLatchB && !Gia_ObjIsRo(pGia, pObj) )
                    continue;
                ClassB = iObj;
            }
        }
        // undo equivalence classes
        for ( iObj = i, iNext = Gia_ObjNext(pGia, iObj); iObj;
              iObj = iNext, iNext = Gia_ObjNext(pGia, iObj) )
        {
            Gia_ObjUnsetRepr( pGia, iObj );
            Gia_ObjSetNext( pGia, iObj, 0 );
        }
        assert( !Gia_ObjIsHead(pGia, i) );
        if ( ClassA > 0 && ClassB > 0 )
        {
            if ( ClassA > ClassB )
            {
                ClassA ^= ClassB;
                ClassB ^= ClassA;
                ClassA ^= ClassB;
            }
            assert( ClassA < ClassB );
            Gia_ObjSetNext( pGia, ClassA, ClassB );
            Gia_ObjSetRepr( pGia, ClassB, ClassA );
            Counter++;
            assert( Gia_ObjIsHead(pGia, ClassA) );
        }
    }
    Abc_Print( 1, "The number of two-node classes after filtering = %d.\n", Counter );
//Gia_ManEquivPrintClasses( pGia, 1, 0 );

    Gia_ManCleanMark0( pGia );
    Gia_ManCleanMark1( pGia );
    return 1;
}